

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float16.cpp
# Opt level: O0

uint16_t float2half(float *val)

{
  float fVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  bool bVar5;
  bool local_2a;
  bool local_29;
  bool local_26;
  bool local_25;
  ushort local_22;
  short local_20;
  uint16_t ret;
  uint16_t frac16;
  uint16_t exp16;
  int8_t exp32_diff;
  uint8_t exp32;
  uint32_t frac32;
  uint16_t sign;
  uint32_t bits;
  float *val_local;
  
  fVar1 = *val;
  cVar2 = (char)(((uint)fVar1 & 0x7f800000) >> 0x17);
  cVar3 = cVar2 + -0x7f;
  uVar4 = ((uint)fVar1 & 0x7fffff) >> 0xd;
  local_22 = (ushort)uVar4;
  local_25 = cVar2 == -1 || '\x0f' < cVar3;
  if (local_25) {
    local_20 = 0x1f;
  }
  else {
    local_26 = cVar2 == '\0' || cVar3 < -0xe;
    if (local_26) {
      local_20 = 0;
    }
    else {
      local_20 = cVar3 + 0xf;
    }
  }
  bVar5 = false;
  if ((cVar2 == -1) && (bVar5 = false, ((uint)fVar1 & 0x7fffff) != 0)) {
    bVar5 = local_22 == 0;
  }
  if (bVar5) {
    local_22 = 0x200;
  }
  else {
    local_29 = true;
    if (cVar2 != '\0') {
      local_29 = local_20 == 0x1f && cVar2 != -1;
    }
    if (local_29) {
      local_22 = 0;
    }
    else {
      local_2a = local_20 == 0 && cVar2 != '\0';
      if (local_2a) {
        local_22 = (ushort)((int)uVar4 >> 2) | 0x100;
      }
    }
  }
  return (ushort)((uint)fVar1 >> 0x10) & 0x8000 | local_20 << 10 | local_22;
}

Assistant:

static uint16_t float2half(const float& val) {
#ifndef __F16CINTRIN_H
  const uint32_t bits = *reinterpret_cast<const uint32_t*>(&val);

  // Extract the sign from the float value
  const uint16_t sign = (bits & 0x80000000) >> 16;
  // Extract the fraction from the float value
  const uint32_t frac32 = bits & 0x7fffff;
  // Extract the exponent from the float value
  const uint8_t exp32 = (bits & 0x7f800000) >> 23;
  const int8_t exp32_diff = exp32 - 127;

  uint16_t exp16 = 0;
  uint16_t frac16 = frac32 >> 13;

  if (__builtin_expect(exp32 == 0xff || exp32_diff > 15, 0)) {
    exp16 = 0x1f;
  } else if (__builtin_expect(exp32 == 0 || exp32_diff < -14, 0)) {
    exp16 = 0;
  } else {
    exp16 = exp32_diff + 15;
  }

  if (__builtin_expect(exp32 == 0xff && frac32 != 0 && frac16 == 0, 0)) {
    // corner case 1: NaN
    // This case happens when FP32 value is NaN whose the fraction part
    // transformed to FP16 counterpart is truncated to 0. We need to flip the
    // high bit to 1 to make it distinguished from inf.
    frac16 = 0x200;
  } else if (__builtin_expect(exp32 == 0 ||
                              (exp16 == 0x1f && exp32 != 0xff), 0)) {
    // corner case 2: subnormal
    // All FP32 subnormal values are under the range of FP16 so the fraction
    // part is set to 0.
    // corner case 3: overflow
    frac16 = 0;
  } else if (__builtin_expect(exp16 == 0 && exp32 != 0, 0)) {
    // corner case 4: underflow
    // We use `truncate` mode here.
    frac16 = 0x100 | (frac16 >> 2);
  }

  // Compose the final FP16 binary
  uint16_t ret = 0;
  ret |= sign;
  ret |= exp16 << 10;
  ret |= frac16;

  return ret;
#else
  return _cvtss_sh(val, 0);
#endif
}